

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::integer_parser<unsigned_long>(string *text,unsigned_long *value)

{
  bool bVar1;
  int iVar2;
  difference_type dVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  reference pcVar6;
  unsigned_long *puVar7;
  unsigned_long *in_RSI;
  undefined8 in_RDI;
  US digit;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iter;
  US result;
  value_type value_match;
  uint8_t base;
  bool negative;
  bool is_signed;
  unsigned_long umax;
  smatch match;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff40;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  long local_80;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  unsigned_long local_70;
  char *local_68;
  char *local_60;
  undefined8 local_58;
  byte local_4b;
  byte local_4a;
  undefined1 local_49;
  undefined8 local_48;
  undefined4 local_40;
  string *in_stack_ffffffffffffffc8;
  argument_incorrect_type *in_stack_ffffffffffffffd0;
  
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_ffffffffffffff30);
  std::
  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (match_flag_type)(in_stack_ffffffffffffff38 >> 0x20));
  dVar3 = std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
  if (dVar3 == 0) {
    uVar4 = __cxa_allocate_exception(0x28);
    argument_incorrect_type::argument_incorrect_type
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __cxa_throw(uVar4,&argument_incorrect_type::typeinfo,
                argument_incorrect_type::~argument_incorrect_type);
  }
  dVar3 = std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
  if (dVar3 < 1) {
    local_48 = 0xffffffffffffffff;
    local_49 = 0;
    dVar3 = std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    local_4a = 0 < dVar3;
    dVar3 = std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    local_4b = 10;
    if (0 < dVar3) {
      local_4b = 0x10;
    }
    pvVar5 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_78._M_current =
         (pvVar5->
         super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ).first._M_current;
    local_60 = (pvVar5->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).second._M_current;
    local_58 = *(undefined8 *)&pvVar5->matched;
    local_70 = 0;
    local_68 = local_78._M_current;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28), bVar1) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_78);
      if ((*pcVar6 < '0') ||
         (pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_78), '9' < *pcVar6)) {
        if ((local_4b == 0x10) &&
           ((pcVar6 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_78), '`' < *pcVar6 &&
            (pcVar6 = __gnu_cxx::
                      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_78), *pcVar6 < 'g')))) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_78);
          iVar2 = *pcVar6 + -0x57;
        }
        else {
          if ((local_4b != 0x10) ||
             ((pcVar6 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&local_78), *pcVar6 < 'A' ||
              (pcVar6 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&local_78), 'F' < *pcVar6)))) {
            uVar4 = __cxa_allocate_exception(0x28);
            argument_incorrect_type::argument_incorrect_type
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
            __cxa_throw(uVar4,&argument_incorrect_type::typeinfo,
                        argument_incorrect_type::~argument_incorrect_type);
          }
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_78);
          iVar2 = *pcVar6 + -0x37;
        }
      }
      else {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_78);
        iVar2 = *pcVar6 + -0x30;
      }
      local_80 = (long)iVar2;
      if (-local_80 - 1U < local_70 * local_4b) {
        uVar4 = __cxa_allocate_exception(0x28);
        argument_incorrect_type::argument_incorrect_type
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        __cxa_throw(uVar4,&argument_incorrect_type::typeinfo,
                    argument_incorrect_type::~argument_incorrect_type);
      }
      local_70 = local_70 * local_4b + local_80;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_78);
    }
    detail::check_signed_range<unsigned_long,unsigned_long>
              (SUB81((ulong)pvVar5 >> 0x38,0),in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if ((local_4a & 1) == 0) {
      *in_RSI = local_70;
    }
    else {
      puVar7 = checked_negate<unsigned_long,unsigned_long&>(&local_70,in_RDI);
      *in_RSI = *puVar7;
    }
    local_40 = 0;
  }
  else {
    *in_RSI = 0;
    local_40 = 1;
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x17e540);
  return;
}

Assistant:

void
        integer_parser(const std::string& text, T& value)
        {
            std::smatch match;
            std::regex_match(text, match, integer_pattern);

            if (match.length() == 0)
            {
                throw argument_incorrect_type(text);
            }

            if (match.length(4) > 0)
            {
                value = 0;
                return;
            }

            using US = typename std::make_unsigned<T>::type;

            constexpr auto umax = std::numeric_limits<US>::max();
            constexpr bool is_signed = std::numeric_limits<T>::is_signed;
            const bool negative = match.length(1) > 0;
            const uint8_t base = match.length(2) > 0 ? 16 : 10;

            auto value_match = match[3];

            US result = 0;

            for (auto iter = value_match.first; iter != value_match.second; ++iter)
            {
                US digit = 0;

                if (*iter >= '0' && *iter <= '9')
                {
                    digit = *iter - '0';
                }
                else if (base == 16 && *iter >= 'a' && *iter <= 'f')
                {
                    digit = *iter - 'a' + 10;
                }
                else if (base == 16 && *iter >= 'A' && *iter <= 'F')
                {
                    digit = *iter - 'A' + 10;
                }
                else
                {
                    throw argument_incorrect_type(text);
                }

                if (umax - digit < result * base)
                {
                    throw argument_incorrect_type(text);
                }

                result = result * base + digit;
            }

            detail::check_signed_range<T>(negative, result, text);

            if (negative)
            {
                value = checked_negate<T>(result,
                                          text,
                                          std::integral_constant<bool, is_signed>());
            }
            else
            {
                value = result;
            }
        }